

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

void __thiscall
pbrt::Disk::Disk(Disk *this,Transform *renderFromObject,Transform *objectFromRender,
                bool reverseOrientation,Float height,Float radius,Float innerRadius,Float phiMax)

{
  bool bVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  float deg;
  Float FVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  float in_XMM3_Da;
  Transform *in_stack_00000110;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(byte *)(in_RDI + 2) = in_CL & 1;
  bVar1 = Transform::SwapsHandedness(in_stack_00000110);
  *(bool *)((long)in_RDI + 0x11) = bVar1;
  *(undefined4 *)((long)in_RDI + 0x14) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 3) = in_XMM1_Da;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_XMM2_Da;
  deg = Clamp<float,int,int>(in_XMM3_Da,0,0x168);
  FVar2 = Radians(deg);
  *(Float *)(in_RDI + 4) = FVar2;
  return;
}

Assistant:

Disk(const Transform *renderFromObject, const Transform *objectFromRender,
         bool reverseOrientation, Float height, Float radius, Float innerRadius,
         Float phiMax)
        : renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          transformSwapsHandedness(renderFromObject->SwapsHandedness()),
          height(height),
          radius(radius),
          innerRadius(innerRadius),
          phiMax(Radians(Clamp(phiMax, 0, 360))) {}